

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CEditor::SortImages(CEditor *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  CEditorImage **ppCVar7;
  long in_RDI;
  long in_FS_OFFSET;
  int NewIndex;
  int OldIndex;
  int i;
  bool Sorted;
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> lTemp;
  CEditorImage *in_stack_ffffffffffffff38;
  CEditorImage *in_stack_ffffffffffffff40;
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *this_00;
  CEditor *in_stack_ffffffffffffff48;
  CEditorMap *in_stack_ffffffffffffff50;
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_3c;
  int local_38;
  int local_28;
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = true;
  local_28 = 1;
  do {
    iVar4 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size
                      ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)
                       (in_RDI + 0x1260));
    if (iVar4 <= local_28) {
LAB_001ec852:
      if (!bVar2) {
        array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::array
                  ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
        iVar4 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size(&local_18);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)iVar4;
        uVar6 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        gs_pSortedIndex = (int *)operator_new__(uVar6);
        array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                  ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)(in_RDI + 0x1260),0)
        ;
        iVar4 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size
                          ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)
                           (in_RDI + 0x1260));
        array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                  ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)(in_RDI + 0x1260),
                   iVar4);
        std::stable_sort<CEditorImage**,int(*)(CEditorImage_const*,CEditorImage_const*)>
                  ((CEditorImage **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (CEditorImage **)in_stack_ffffffffffffff58,
                   (_func_int_CEditorImage_ptr_CEditorImage_ptr *)in_stack_ffffffffffffff50);
        local_38 = 0;
        while( true ) {
          iVar4 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size(&local_18);
          if (iVar4 <= local_38) break;
          local_3c = 0;
          while( true ) {
            iVar4 = local_3c;
            iVar5 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size
                              ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)
                               (in_RDI + 0x1260));
            if (iVar5 <= iVar4) break;
            ppCVar7 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                                (&local_18,local_38);
            in_stack_ffffffffffffff48 = (CEditor *)*ppCVar7;
            in_stack_ffffffffffffff50 =
                 (CEditorMap *)
                 array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                           ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)
                            (in_RDI + 0x1260),local_3c);
            if (in_stack_ffffffffffffff48 == in_stack_ffffffffffffff50->m_pEditor) {
              gs_pSortedIndex[local_38] = local_3c;
            }
            local_3c = local_3c + 1;
          }
          local_38 = local_38 + 1;
        }
        CEditorMap::ModifyImageIndex
                  (in_stack_ffffffffffffff50,(INDEX_MODIFY_FUNC)in_stack_ffffffffffffff48);
        this_00 = (array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)gs_pSortedIndex;
        if (gs_pSortedIndex != (int *)0x0) {
          operator_delete__(gs_pSortedIndex);
          this_00 = (array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)gs_pSortedIndex;
        }
        gs_pSortedIndex = (int *)0x0;
        array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::~array(this_00);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
              ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)(in_RDI + 0x1260),
               local_28);
    array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
              ((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)(in_RDI + 0x1260),
               local_28 + -1);
    bVar3 = CEditorImage::operator<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (bVar3) {
      bVar2 = false;
      goto LAB_001ec852;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void CEditor::SortImages()
{
	bool Sorted = true;
	for(int i = 1; i < m_Map.m_lImages.size(); i++)
		if(*m_Map.m_lImages[i] < *m_Map.m_lImages[i-1])
		{
			Sorted = false;
			break;
		}

	if(!Sorted)
	{
		array<CEditorImage*> lTemp = array<CEditorImage*>(m_Map.m_lImages);
		gs_pSortedIndex = new int[lTemp.size()];

		std::stable_sort(&m_Map.m_lImages[0], &m_Map.m_lImages[m_Map.m_lImages.size()], CompareImage);

		for(int OldIndex = 0; OldIndex < lTemp.size(); OldIndex++)
			for(int NewIndex = 0; NewIndex < m_Map.m_lImages.size(); NewIndex++)
				if(lTemp[OldIndex] == m_Map.m_lImages[NewIndex])
					gs_pSortedIndex[OldIndex] = NewIndex;

		m_Map.ModifyImageIndex(ModifySortedIndex);

		delete [] gs_pSortedIndex;
		gs_pSortedIndex = 0;
	}
}